

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestSubmitHandler.cxx
# Opt level: O1

void __thiscall
cmCTestSubmitHandler::SelectParts
          (cmCTestSubmitHandler *this,
          set<cmCTest::Part,_std::less<cmCTest::Part>,_std::allocator<cmCTest::Part>_> *parts)

{
  _Base_ptr p_Var1;
  long lVar2;
  _Base_ptr p_Var3;
  _Rb_tree_header *p_Var4;
  _Base_ptr p_Var5;
  
  p_Var1 = (parts->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var4 = &(parts->_M_t)._M_impl.super__Rb_tree_header;
  lVar2 = 0;
  p_Var5 = p_Var1;
  p_Var3 = &p_Var4->_M_header;
  do {
    for (; p_Var5 != (_Base_ptr)0x0; p_Var5 = (&p_Var5->_M_left)[(int)p_Var5[1]._M_color < lVar2]) {
      if (lVar2 <= (int)p_Var5[1]._M_color) {
        p_Var3 = p_Var5;
      }
    }
    p_Var5 = &p_Var4->_M_header;
    if (((_Rb_tree_header *)p_Var3 != p_Var4) && (p_Var5 = p_Var3, lVar2 < (int)p_Var3[1]._M_color))
    {
      p_Var5 = &p_Var4->_M_header;
    }
    this->SubmitPart[lVar2] = (_Rb_tree_header *)p_Var5 != p_Var4;
    lVar2 = lVar2 + 1;
    p_Var5 = p_Var1;
    p_Var3 = &p_Var4->_M_header;
  } while (lVar2 != 0xc);
  return;
}

Assistant:

void cmCTestSubmitHandler::SelectParts(std::set<cmCTest::Part> const& parts)
{
  // Check whether each part is selected.
  for (cmCTest::Part p = cmCTest::PartStart; p != cmCTest::PartCount;
       p = static_cast<cmCTest::Part>(p + 1)) {
    this->SubmitPart[p] = parts.find(p) != parts.end();
  }
}